

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QFormLayoutItem_*>::data(QList<QFormLayoutItem_*> *this)

{
  QArrayDataPointer<QFormLayoutItem_*> *this_00;
  QFormLayoutItem **ppQVar1;
  QArrayDataPointer<QFormLayoutItem_*> *in_RDI;
  
  detach((QList<QFormLayoutItem_*> *)0x4bc2ec);
  this_00 = (QArrayDataPointer<QFormLayoutItem_*> *)
            QArrayDataPointer<QFormLayoutItem_*>::operator->(in_RDI);
  ppQVar1 = QArrayDataPointer<QFormLayoutItem_*>::data(this_00);
  return ppQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }